

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementType::~IfcBuildingElementType
          (IfcBuildingElementType *this)

{
  IfcTypeObject *this_00;
  long *plVar1;
  long lVar2;
  void *pvVar3;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject
                   + -0x18);
  this_00 = (IfcTypeObject *)
            (&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
            lVar2);
  plVar1 = (long *)(&(this->super_IfcElementType).field_0x168 + lVar2);
  plVar1[-0x2d] = 0x813628;
  plVar1[5] = 0x8136f0;
  plVar1[-0x1c] = 0x813650;
  plVar1[-0x1a] = 0x813678;
  plVar1[-0xf] = 0x8136a0;
  plVar1[-4] = 0x8136c8;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  *(undefined8 *)this_00 = 0x813718;
  *(undefined8 *)&this_00[1].field_0x88 = 0x8137b8;
  *(undefined8 *)&this_00->field_0x88 = 0x813740;
  (this_00->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0x813768;
  *(undefined8 *)&this_00->field_0xf0 = 0x813790;
  if (*(undefined1 **)&this_00[1].field_0x18 != &this_00[1].field_0x28) {
    operator_delete(*(undefined1 **)&this_00[1].field_0x18,*(long *)&this_00[1].field_0x28 + 1);
  }
  pvVar3 = *(void **)&this_00->field_0x100;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&this_00[1].field_0x8 - (long)pvVar3);
  }
  IfcTypeObject::~IfcTypeObject(this_00,&PTR_construction_vtable_24__008134f0);
  operator_delete(this_00,0x1a8);
  return;
}

Assistant:

IfcBuildingElementType() : Object("IfcBuildingElementType") {}